

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_qsbr_oom.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_ead8::QSBROOMTest_Resume_Test::~QSBROOMTest_Resume_Test
          (QSBROOMTest_Resume_Test *this)

{
  unodb::test::QSBRTestBase::~QSBRTestBase(&this->super_QSBROOMTest);
  operator_delete(this,0x18);
  return;
}

Assistant:

UNODB_TEST_F(QSBROOMTest, Resume) {
  qsbr_pause();
  UNODB_ASSERT_EQ(get_qsbr_thread_count(), 0);
  oom_test(
      3, [] { unodb::this_thread().qsbr_resume(); },
      []() noexcept { UNODB_ASSERT_EQ(get_qsbr_thread_count(), 0); });
  UNODB_ASSERT_EQ(get_qsbr_thread_count(), 1);
}